

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O1

int __thiscall
NaDynAr<NaControlLawItem>::insert(NaDynAr<NaControlLawItem> *this,int index,NaControlLawItem *pobj)

{
  int iVar1;
  item *piVar2;
  undefined4 *puVar3;
  item *piVar4;
  int iVar5;
  
  if (pobj == (NaControlLawItem *)0x0) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
    __cxa_throw(puVar3,&NaException::typeinfo,0);
  }
  piVar2 = (item *)operator_new(0x10);
  piVar2->pData = pobj;
  piVar2->pNext = (item *)0x0;
  iVar1 = this->nItems;
  if (iVar1 == index) {
    this->pTail->pNext = piVar2;
    piVar2->pNext = (item *)0x0;
  }
  else {
    if (index < iVar1 && -1 < index) {
      piVar4 = this->pHead;
      iVar5 = index;
      if (0 < index) {
        do {
          piVar4 = piVar4->pNext;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
    else {
      piVar4 = (item *)0x0;
    }
    piVar2->pNext = piVar4;
    if (index == 0) {
      this->pHead = piVar2;
    }
    else {
      piVar4 = this->pHead;
      if (index != 1) {
        iVar5 = index + -1;
        do {
          piVar4 = piVar4->pNext;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      piVar4->pNext = piVar2;
    }
  }
  this->nItems = iVar1 + 1;
  return index;
}

Assistant:

virtual int   insert (int index, type* pobj) {
    if(NULL == pobj)
      throw(na_null_pointer);

    item  *p = new item(pobj);

#ifdef DynAr_DEBUG
    NaPrintLog("DynAr::insert(this=0x%08p), %d items, new item=0x%08p at %d\n",
	       this, nItems, p, index);
#endif /* DynAr_DEBUG */

    if(nItems == index){
      pTail->pNext = p;
      p->pNext = NULL;
    }
    else{
      item    *pNext = fetch_item(index);
      p->pNext = pNext;
      if(0 == index)
	pHead = p;
      else
	fetch_item(index - 1)->pNext = p;
    }
    ++nItems;

    return index;
  }